

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnTag(SharedValidator *this,Location *loc,Var *sig_var)

{
  bool bVar1;
  value_type local_d0;
  Enum local_b4;
  Var local_b0;
  Enum local_64;
  undefined1 local_60 [8];
  FuncType type;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  type._48_8_ = sig_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  FuncType::FuncType((FuncType *)local_60);
  Var::Var(&local_b0,sig_var);
  local_64 = (Enum)CheckFuncTypeIndex(this,&local_b0,(FuncType *)local_60);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_64);
  Var::~Var(&local_b0);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                     &type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    local_b4 = (Enum)PrintError(this,loc,"Tag signature must have 0 results.");
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_b4);
  }
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_d0.params,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_60);
  std::vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>::
  push_back(&this->tags_,&local_d0);
  TagType::~TagType(&local_d0);
  FuncType::~FuncType((FuncType *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTag(const Location& loc, Var sig_var) {
  Result result = Result::Ok;
  FuncType type;
  result |= CheckFuncTypeIndex(sig_var, &type);
  if (!type.results.empty()) {
    result |= PrintError(loc, "Tag signature must have 0 results.");
  }
  tags_.push_back(TagType{type.params});
  return result;
}